

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

void __thiscall jsonnet::internal::anon_unknown_0::Stack::~Stack(Stack *this)

{
  pointer pFVar1;
  pointer pFVar2;
  
  this->_vptr_Stack = (_func_int **)&PTR_dump_002a0458;
  pFVar1 = (this->stack).
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pFVar2 = (this->stack).
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                ._M_impl.super__Vector_impl_data._M_start; pFVar2 != pFVar1; pFVar2 = pFVar2 + 1) {
    Frame::~Frame(pFVar2);
  }
  pFVar2 = (this->stack).
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pFVar2 != (pointer)0x0) {
    operator_delete(pFVar2,(long)(this->stack).
                                 super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pFVar2);
    return;
  }
  return;
}

Assistant:

~Stack(void) {}